

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IRRImporter::CopyMaterial
          (IRRImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,
          vector<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
          *inmaterials,uint *defMatIdx,aiMesh *mesh)

{
  pointer ppVar1;
  pointer ppVar2;
  uint uVar3;
  Logger *this_00;
  
  ppVar1 = (inmaterials->
           super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (inmaterials->
           super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    if (0x10 < (ulong)((long)ppVar2 - (long)ppVar1)) {
      this_00 = DefaultLogger::get();
      Logger::info(this_00,"IRR: Skipping additional materials");
    }
    mesh->mMaterialIndex =
         (uint)((ulong)((long)(materials->
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
              (materials,
               &((inmaterials->
                 super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->first);
    return;
  }
  uVar3 = *defMatIdx;
  if (uVar3 == 0xffffffff) {
    uVar3 = (uint)((ulong)((long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(materials->
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    *defMatIdx = uVar3;
  }
  mesh->mMaterialIndex = uVar3;
  return;
}

Assistant:

void IRRImporter::CopyMaterial(std::vector<aiMaterial*>& materials,
    std::vector< std::pair<aiMaterial*, unsigned int> >& inmaterials,
    unsigned int& defMatIdx,
    aiMesh* mesh)
{
    if (inmaterials.empty())    {
        // Do we have a default material? If not we need to create one
        if (UINT_MAX == defMatIdx)
        {
            defMatIdx = (unsigned int)materials.size();
            //TODO: add this materials to someone?
            /*aiMaterial* mat = new aiMaterial();

            aiString s;
            s.Set(AI_DEFAULT_MATERIAL_NAME);
            mat->AddProperty(&s,AI_MATKEY_NAME);

            aiColor3D c(0.6f,0.6f,0.6f);
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_DIFFUSE);*/
        }
        mesh->mMaterialIndex = defMatIdx;
        return;
    }
    else if (inmaterials.size() > 1)    {
        ASSIMP_LOG_INFO("IRR: Skipping additional materials");
    }

    mesh->mMaterialIndex = (unsigned int)materials.size();
    materials.push_back(inmaterials[0].first);
}